

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_normalize_float(ShaderEvalContext *c)

{
  float fVar1;
  
  fVar1 = c->in[0].m_data[2];
  (c->color).m_data[0] = (1.0 / SQRT(fVar1 * fVar1 + 0.0)) * fVar1;
  return;
}

Assistant:

Vector<T, 1>			swizzle		(int a) const { DE_ASSERT(a >= 0 && a < Size); return Vector<T, 1>(m_data[a]); }